

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Enable(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar2 = false;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"rvh"), iVar3 == 0x76) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (iVar3 == -1) break;
    if (iVar3 != 0x72) {
      iVar3 = -2;
      Abc_Print(-2,"usage: &enable [-rvh]\n");
      Abc_Print(-2,"\t         adds or removes flop enable signals\n");
      pcVar5 = "remove";
      if (!bVar1) {
        pcVar5 = "add";
      }
      Abc_Print(-2,"\t-r     : toggle adding vs. removing enables [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (!bVar2) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      pcVar5 = "\t-h     : print the command usage\n";
LAB_00243632:
      Abc_Print(iVar3,pcVar5);
      return 1;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  pGVar4 = pAbc->pGia;
  if (pGVar4 != (Gia_Man_t *)0x0) {
    if (bVar1) {
      pGVar4 = Gia_ManRemoveEnables(pGVar4);
    }
    else {
      pGVar4 = Gia_ManDupSelf(pGVar4);
    }
    Abc_FrameUpdateGia(pAbc,pGVar4);
    return 0;
  }
  pcVar5 = "Abc_CommandAbc9Enable(): There is no AIG.\n";
  iVar3 = -1;
  goto LAB_00243632;
}

Assistant:

int Abc_CommandAbc9Enable( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c;
    int fRemove  = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "rvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'r':
            fRemove ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Enable(): There is no AIG.\n" );
        return 1;
    }
    if ( fRemove )
        pTemp = Gia_ManRemoveEnables( pAbc->pGia );
    else
        pTemp = Gia_ManDupSelf( pAbc->pGia );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &enable [-rvh]\n" );
    Abc_Print( -2, "\t         adds or removes flop enable signals\n" );
    Abc_Print( -2, "\t-r     : toggle adding vs. removing enables [default = %s]\n", fRemove? "remove": "add" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}